

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportInstallFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  pointer pcVar1;
  long *plVar2;
  cmMakefile *this_00;
  _Base_ptr p_Var3;
  cmFileSet *pcVar4;
  bool bVar5;
  cmake *cmakeInstance;
  mapped_type *ppcVar6;
  string *psVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  pointer puVar10;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *puVar11;
  pointer puVar12;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *puVar13;
  long lVar14;
  ulong uVar15;
  _Base_ptr p_Var16;
  undefined8 uVar17;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  _Base_ptr filename;
  bool bVar18;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  string_view str;
  string_view str_00;
  string_view separator;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  destCge;
  string prefix;
  string dest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string escapedFile;
  string unescapedDest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  string relFile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  cmGeneratorExpression destGe;
  cmFileSet *local_410;
  undefined1 local_408 [24];
  string local_3f0;
  cmGeneratorTarget *local_3d0;
  string *local_3c8;
  string *local_3c0;
  undefined1 local_3b8 [8];
  undefined1 local_3b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  string local_358;
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_300;
  string local_2e8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  cmExportInstallFileGenerator *local_2b0;
  string *local_2a8;
  _Rb_tree_node_base *local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_298;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_268;
  string local_250;
  undefined1 local_218 [32];
  long *local_1f8 [2];
  long local_1e8 [2];
  undefined1 local_1d8 [8];
  string *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  string *local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined8 local_198;
  pointer local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  undefined8 local_180;
  undefined8 local_178;
  char *local_170;
  undefined8 local_168 [33];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  cmGeneratorExpression local_48;
  
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410 = fileSet;
  local_3d0 = gte;
  local_3c8 = __return_storage_ptr__;
  local_2b0 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_370,gte->Makefile,IncludeEmptyConfig);
  cmFileSet::CompileFileEntries(&local_300,fileSet);
  cmFileSet::CompileDirectoryEntries(&local_268,local_410);
  cmakeInstance = cmMakefile::GetCMakeInstance(local_3d0->Makefile);
  local_2c8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_2c8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_2c8);
  cmGeneratorExpression::cmGeneratorExpression
            (&local_48,cmakeInstance,(cmListFileBacktrace *)&local_2c8);
  if (local_2c8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ppcVar6 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&local_410);
  pcVar1 = ((*ppcVar6)->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,pcVar1,
             pcVar1 + ((*ppcVar6)->super_cmInstallGenerator).Destination._M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_3b8,(string *)&local_48);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  local_2a8 = (string *)local_370._8_8_;
  if (local_370._M_allocated_capacity != local_370._8_8_) {
    local_2b8 = &local_3c8->field_2;
    uVar17 = local_370._M_allocated_capacity;
    do {
      local_3c0 = (string *)uVar17;
      cmFileSet::EvaluateDirectoryEntries
                (&local_60,local_410,&local_268,local_3d0->LocalGenerator,(string *)uVar17,local_3d0
                 ,(cmGeneratorExpressionDAGChecker *)0x0);
      puVar10 = local_300.
                super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_298._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_298._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_298._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_298._M_impl.super__Rb_tree_header._M_header;
      local_298._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_298._M_impl.super__Rb_tree_header._M_header._M_right =
           local_298._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar12 = local_300.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar10;
          puVar12 = puVar12 + 1) {
        cmFileSet::EvaluateFileEntry
                  (local_410,&local_60,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&local_298,puVar12,local_3d0->LocalGenerator,local_3c0,local_3d0,
                   (cmGeneratorExpressionDAGChecker *)0x0);
      }
      local_1d0 = (string *)0x0;
      local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
      uVar17 = 0;
      local_1d8 = (undefined1  [8])&local_1c8;
      psVar7 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_3b8,local_3d0->LocalGenerator,
                          local_3c0,local_3d0,(cmGeneratorExpressionDAGChecker *)0x0,
                          (cmGeneratorTarget *)0x0,(string *)local_1d8);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_338,pcVar1,pcVar1 + psVar7->_M_string_length);
      if (local_1d8 != (undefined1  [8])&local_1c8) {
        operator_delete((void *)local_1d8,local_1c8._M_allocated_capacity + 1);
      }
      str._M_str = (char *)0x1;
      str._M_len = (size_t)local_338._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_250,(cmOutputConverter *)local_338._M_string_length,str,(WrapQuotes)uVar17);
      local_408._0_8_ = local_250._M_string_length;
      local_408._8_8_ = local_250._M_dataplus._M_p;
      local_1d8 = (undefined1  [8])0x0;
      local_1d0 = (string *)0x1;
      local_3f0._M_string_length = (size_type)(local_1c8._M_local_buf + 8);
      local_1c8._M_local_buf[8] = 0x2f;
      local_3f0._M_dataplus._M_p = (pointer)0x1;
      local_3f0.field_2._M_allocated_capacity = 0;
      views._M_len = 2;
      views._M_array = (iterator)local_408;
      local_408._16_8_ = &local_250;
      local_1c8._M_allocated_capacity = local_3f0._M_string_length;
      cmCatViews((string *)&local_390,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        (ulong)(local_250.field_2._M_allocated_capacity + 1));
      }
      bVar5 = cmsys::SystemTools::FileIsFullPath(&local_338);
      if (!bVar5) {
        local_1d8 = (undefined1  [8])0x12;
        local_1d0 = (string *)0x915503;
        local_1c8._M_allocated_capacity = 0;
        local_1c8._8_8_ = local_390._8_8_;
        local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_390._M_allocated_capacity;
        local_1b0 = (string *)0x0;
        views_00._M_len = 2;
        views_00._M_array = (iterator)local_1d8;
        cmCatViews((string *)local_408,views_00);
        std::__cxx11::string::operator=((string *)local_390._M_local_buf,(string *)local_408);
        if ((_Base_ptr)local_408._0_8_ != (_Base_ptr)(local_408 + 0x10)) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
      }
      pcVar4 = local_410;
      p_Var9 = local_298._M_impl.super__Rb_tree_header._M_header._M_left;
      if (*(bool *)((long)local_3b8 + 0x130) == false) {
        uVar15 = (long)local_268.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_268.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        puVar10 = local_268.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (long)uVar15 >> 5) {
          puVar10 = (pointer)((long)&((local_268.
                                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                     super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                     .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                     _M_head_impl + (uVar15 & 0xffffffffffffffe0));
          lVar14 = ((long)uVar15 >> 5) + 1;
          puVar12 = local_268.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if ((puVar12[-2]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar12 = puVar12 + -2;
              goto LAB_006c2735;
            }
            if ((puVar12[-1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar12 = puVar12 + -1;
              goto LAB_006c2735;
            }
            if (((puVar12->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) goto LAB_006c2735;
            if ((puVar12[1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar12 = puVar12 + 1;
              goto LAB_006c2735;
            }
            lVar14 = lVar14 + -1;
            puVar12 = puVar12 + 4;
          } while (1 < lVar14);
          uVar15 = (long)local_268.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10;
        }
        lVar14 = (long)uVar15 >> 3;
        if (lVar14 == 1) {
LAB_006c2712:
          puVar12 = puVar10;
          if (((puVar10->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar12 = local_268.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
LAB_006c2735:
          if (puVar12 !=
              local_268.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006c282e;
        }
        else {
          if (lVar14 == 2) {
LAB_006c2702:
            puVar12 = puVar10;
            if (((puVar10->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar10 = puVar10 + 1;
              goto LAB_006c2712;
            }
            goto LAB_006c2735;
          }
          if (lVar14 == 3) {
            puVar12 = puVar10;
            if (((puVar10->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar10 = puVar10 + 1;
              goto LAB_006c2702;
            }
            goto LAB_006c2735;
          }
        }
        uVar15 = (long)local_300.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_300.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        puVar11 = local_300.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (long)uVar15 >> 5) {
          puVar11 = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)((long)&((local_300.
                                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                               _M_head_impl + (uVar15 & 0xffffffffffffffe0));
          lVar14 = ((long)uVar15 >> 5) + 1;
          puVar13 = local_300.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if ((puVar13[-2]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar13 = puVar13 + -2;
              goto LAB_006c2825;
            }
            if ((puVar13[-1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar13 = puVar13 + -1;
              goto LAB_006c2825;
            }
            if (((puVar13->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) goto LAB_006c2825;
            if ((puVar13[1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar13 = puVar13 + 1;
              goto LAB_006c2825;
            }
            lVar14 = lVar14 + -1;
            puVar13 = puVar13 + 4;
          } while (1 < lVar14);
          uVar15 = (long)local_300.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar11;
        }
        lVar14 = (long)uVar15 >> 3;
        if (lVar14 == 1) {
LAB_006c2802:
          puVar13 = puVar11;
          if (((puVar11->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar13 = local_300.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
LAB_006c2825:
          if (puVar13 !=
              local_300.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_006c282e;
        }
        else {
          if (lVar14 == 2) {
LAB_006c27f2:
            puVar13 = puVar11;
            if (((puVar11->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar11 = puVar11 + 1;
              goto LAB_006c2802;
            }
            goto LAB_006c2825;
          }
          if (lVar14 == 3) {
            puVar13 = puVar11;
            if (((puVar11->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar11 = puVar11 + 1;
              goto LAB_006c27f2;
            }
            goto LAB_006c2825;
          }
        }
        bVar5 = false;
LAB_006c29c4:
        while ((_Rb_tree_header *)p_Var9 != &local_298._M_impl.super__Rb_tree_header) {
          if (p_Var9[1]._M_parent == (_Base_ptr)0x0) {
            local_3b0._0_8_ = local_3b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"");
          }
          else {
            local_408._8_8_ = *(undefined8 *)(p_Var9 + 1);
            local_408._16_8_ = (string *)0x0;
            local_1d8 = (undefined1  [8])0x0;
            local_1d0 = (string *)0x1;
            local_3f0._M_string_length = (size_type)(local_1c8._M_local_buf + 8);
            local_1c8._M_local_buf[8] = 0x2f;
            local_3f0._M_dataplus._M_p = (pointer)0x1;
            local_3f0.field_2._M_allocated_capacity = 0;
            views_01._M_len = 2;
            views_01._M_array = (iterator)local_408;
            local_408._0_8_ = p_Var9[1]._M_parent;
            local_1c8._M_allocated_capacity = local_3f0._M_string_length;
            cmCatViews((string *)local_3b0,views_01);
          }
          p_Var3 = p_Var9[2]._M_parent;
          local_2a0 = p_Var9;
          for (filename = *(_Base_ptr *)(p_Var9 + 2); filename != p_Var3; filename = filename + 1) {
            cmsys::SystemTools::GetFilenameName((string *)local_408,(string *)filename);
            local_1d8 = (undefined1  [8])local_3b0._8_8_;
            local_1d0 = (string *)local_3b0._0_8_;
            local_1c8._M_allocated_capacity = 0;
            local_1c8._8_8_ = local_408._8_8_;
            local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_408._0_8_;
            views_02._M_len = 2;
            views_02._M_array = (iterator)local_1d8;
            local_1b0 = (string *)local_408;
            cmCatViews(&local_2e8,views_02);
            if ((_Base_ptr)local_408._0_8_ != (_Base_ptr)(local_408 + 0x10)) {
              operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
            }
            str_00._M_str = (char *)0x1;
            str_00._M_len = (size_t)local_2e8._M_dataplus._M_p;
            cmOutputConverter::EscapeForCMake_abi_cxx11_
                      ((string *)local_408,(cmOutputConverter *)local_2e8._M_string_length,str_00,
                       (WrapQuotes)uVar17);
            local_1d8 = (undefined1  [8])local_390._8_8_;
            local_1d0 = (string *)local_390._M_allocated_capacity;
            local_1c8._M_allocated_capacity = 0;
            local_1c8._8_8_ = local_408._8_8_;
            local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_408._0_8_;
            views_03._M_len = 2;
            views_03._M_array = (iterator)local_1d8;
            local_1b0 = (string *)local_408;
            cmCatViews(&local_358,views_03);
            if ((_Base_ptr)local_408._0_8_ != (_Base_ptr)(local_408 + 0x10)) {
              operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
            }
            if ((bVar5) && (local_370._8_8_ - local_370._0_8_ != 0x20)) {
              local_1d8 = (undefined1  [8])0xc;
              local_1d0 = (string *)0x9528e7;
              local_1c8._M_allocated_capacity = 0;
              local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_3c0->_M_dataplus)._M_p;
              local_1c8._8_8_ = local_3c0->_M_string_length;
              local_1b0 = (string *)0x0;
              local_1a8 = 2;
              local_1a0 = ">:";
              local_198 = 0;
              local_190 = (pointer)local_358._M_string_length;
              local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_358._M_dataplus._M_p;
              local_180 = 0;
              local_178 = 2;
              local_170 = ">\"";
              local_168[0] = 0;
              views_05._M_len = 5;
              views_05._M_array = (iterator)local_1d8;
              cmCatViews((string *)local_408,views_05);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_318,(string *)local_408);
              psVar7 = (string *)local_408._16_8_;
              p_Var16 = (_Base_ptr)local_408._0_8_;
              if ((_Base_ptr)local_408._0_8_ != (_Base_ptr)(local_408 + 0x10)) {
LAB_006c2da3:
                operator_delete(p_Var16,(ulong)((long)&(psVar7->_M_dataplus)._M_p + 1));
              }
            }
            else {
              local_408._0_8_ = (_Base_ptr)0x0;
              local_408._8_8_ = (pointer)0x1;
              local_408._16_8_ = &local_3f0;
              local_3f0._M_dataplus._M_p._0_1_ = 0x22;
              local_1d8 = (undefined1  [8])0x1;
              local_1c8._M_allocated_capacity = 0;
              local_1c8._8_8_ = local_358._M_string_length;
              local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_358._M_dataplus._M_p;
              local_1b0 = (string *)0x0;
              local_250._M_dataplus._M_p = (pointer)0x0;
              local_250._M_string_length = 1;
              local_250.field_2._M_allocated_capacity = (long)&local_250.field_2 + 8;
              local_250.field_2._M_local_buf[8] = '\"';
              local_1a8 = 1;
              local_198 = 0;
              views_04._M_len = 3;
              views_04._M_array = (iterator)local_1d8;
              local_1d0 = (string *)local_408._16_8_;
              local_1a0 = (char *)local_250.field_2._M_allocated_capacity;
              cmCatViews((string *)local_218,views_04);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_318,(string *)local_218);
              psVar7 = (string *)local_218._16_8_;
              p_Var16 = (_Base_ptr)local_218._0_8_;
              if ((_Base_ptr)local_218._0_8_ != (_Base_ptr)(local_218 + 0x10)) goto LAB_006c2da3;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
              operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((element_type *)local_3b0._0_8_ != (element_type *)(local_3b0 + 0x10)) {
            operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_2a0);
        }
        bVar18 = bVar5 && local_370._8_8_ - local_370._0_8_ != 0x20;
        bVar5 = !bVar5 || local_370._8_8_ - local_370._0_8_ == 0x20;
      }
      else {
LAB_006c282e:
        bVar5 = true;
        if (((local_410->Type)._M_string_length != 0xb) ||
           (plVar2 = (long *)(local_410->Type)._M_dataplus._M_p,
           *(long *)((long)plVar2 + 3) != 0x53454c55444f4d5f || *plVar2 != 0x55444f4d5f585843))
        goto LAB_006c29c4;
        this_00 = local_2b0->IEGen->LocalGenerator->Makefile;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"The \"",5);
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_3d0);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1d8,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\" target\'s interface file set \"",0x1f);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(local_410->Name)._M_dataplus._M_p,
                            (local_410->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" of type \"",0xb);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(pcVar4->Type)._M_dataplus._M_p,(pcVar4->Type)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\" contains context-sensitive base file entries which is not supported.",
                   0x46);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_408);
        if ((_Base_ptr)local_408._0_8_ != (_Base_ptr)(local_408 + 0x10)) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        (local_3c8->_M_dataplus)._M_p = (pointer)local_2b8;
        local_3c8->_M_string_length = 0;
        (local_3c8->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base((ios_base *)local_168);
        bVar18 = false;
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_allocated_capacity != &local_380) {
        operator_delete((void *)local_390._M_allocated_capacity,local_380._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_298);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      if (!bVar18) {
        if (!bVar5) goto LAB_006c2f11;
        break;
      }
      uVar17 = local_3c0 + 1;
    } while ((string *)uVar17 != local_2a8);
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(local_3c8,&local_318,separator,(string_view)ZEXT816(0));
LAB_006c2f11:
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_3b8);
  cmGeneratorExpression::~cmGeneratorExpression(&local_48);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_268);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  return local_3c8;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetFiles(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto fileEntries = fileSet->CompileFileEntries();
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  cmGeneratorExpression destGe(*gte->Makefile->GetCMakeInstance());
  auto destCge =
    destGe.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      fileSet->EvaluateFileEntry(directories, files, entry,
                                 gte->LocalGenerator, config, gte);
    }
    auto unescapedDest = destCge->Evaluate(gte->LocalGenerator, config, gte);
    auto dest =
      cmStrCat(cmOutputConverter::EscapeForCMake(
                 unescapedDest, cmOutputConverter::WrapQuotes::NoWrap),
               '/');
    if (!cmSystemTools::FileIsFullPath(unescapedDest)) {
      dest = cmStrCat("${_IMPORT_PREFIX}/", dest);
    }

    bool const contextSensitive = destCge->GetHadContextSensitiveCondition() ||
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive) ||
      std::any_of(fileEntries.begin(), fileEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive && type == "CXX_MODULES"_s) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& it : files) {
      auto prefix = it.first.empty() ? "" : cmStrCat(it.first, '/');
      for (auto const& filename : it.second) {
        auto relFile =
          cmStrCat(prefix, cmSystemTools::GetFilenameName(filename));
        auto escapedFile =
          cmStrCat(dest,
                   cmOutputConverter::EscapeForCMake(
                     relFile, cmOutputConverter::WrapQuotes::NoWrap));
        if (contextSensitive && configs.size() != 1) {
          resultVector.push_back(
            cmStrCat("\"$<$<CONFIG:", config, ">:", escapedFile, ">\""));
        } else {
          resultVector.emplace_back(cmStrCat('"', escapedFile, '"'));
        }
      }
    }

    if (!(contextSensitive && configs.size() != 1)) {
      break;
    }
  }

  return cmJoin(resultVector, " ");
}